

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O1

shared_ptr<const_tchecker::typed_lvalue_expression_t> __thiscall
tchecker::typed_clock_to_clock_assign_statement_t::rclock_ptr
          (typed_clock_to_clock_assign_statement_t *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<const_tchecker::typed_expression_t> sVar2;
  undefined1 auVar3 [16];
  shared_ptr<const_tchecker::typed_lvalue_expression_t> sVar4;
  undefined1 local_20 [16];
  
  sVar2 = typed_assign_statement_t::rvalue_ptr((typed_assign_statement_t *)local_20);
  if (local_20._0_8_ == 0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar2.
                   super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi._M_pi;
    auVar3 = auVar3 << 0x40;
  }
  else {
    auVar3 = __dynamic_cast(local_20._0_8_,&typed_expression_t::typeinfo,
                            &typed_lvalue_expression_t::typeinfo,0);
  }
  _Var1._M_pi = auVar3._8_8_;
  if (auVar3._0_8_ == 0) {
    *(undefined8 *)&(this->super_typed_assign_statement_t).super_typed_statement_t = 0;
    *(undefined8 *)&(this->super_typed_assign_statement_t).super_typed_statement_t._type = 0;
  }
  else {
    *(long *)&(this->super_typed_assign_statement_t).super_typed_statement_t = auVar3._0_8_;
    *(undefined8 *)&(this->super_typed_assign_statement_t).super_typed_statement_t._type =
         local_20._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_20._8_8_ + 8) = *(_Atomic_word *)(local_20._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_20._8_8_ + 8) = *(_Atomic_word *)(local_20._8_8_ + 8) + 1;
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_);
    _Var1._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar4.super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<const_tchecker::typed_lvalue_expression_t>)
         sVar4.
         super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::typed_lvalue_expression_t const> typed_clock_to_clock_assign_statement_t::rclock_ptr() const
{
  return std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t const>(rvalue_ptr());
}